

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O1

void ZopfliLZ77Optimal(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,int numiterations,
                      ZopfliLZ77Store *store)

{
  size_t *count;
  double *bitlengths;
  double *bitlengths_00;
  unsigned_short *length_array;
  float *costs;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint local_3d70;
  double local_3d58;
  unsigned_short *path;
  ZopfliLZ77Store *local_3d08;
  double *local_3d00;
  size_t *local_3cf8;
  double *local_3cf0;
  double *local_3ce8;
  double *local_3ce0;
  double local_3cd8;
  size_t pathsize;
  RanState ran_state;
  ZopfliHash hash;
  ZopfliLZ77Store currentstore;
  SymbolStats local_3c30;
  SymbolStats laststats;
  SymbolStats beststats;
  
  local_3d08 = store;
  length_array = (unsigned_short *)malloc((inend - instart) * 2 + 2);
  path = (unsigned_short *)0x0;
  pathsize = 0;
  costs = (float *)malloc((inend - instart) * 4 + 4);
  if ((costs != (float *)0x0) && (length_array != (unsigned_short *)0x0)) {
    ran_state.m_w = 1;
    ran_state.m_z = 2;
    memset(&local_3c30,0,0x1400);
    ZopfliInitLZ77Store(in,&currentstore);
    ZopfliAllocHash(0x8000,&hash);
    ZopfliLZ77Greedy(s,in,instart,inend,&currentstore,&hash);
    GetStatistics(&currentstore,&local_3c30);
    if (0 < numiterations) {
      count = local_3c30.dists;
      local_3ce0 = local_3c30.ll_symbols;
      bitlengths = local_3c30.d_symbols;
      local_3cf8 = laststats.dists;
      local_3d00 = laststats.ll_symbols;
      local_3ce8 = laststats.d_symbols;
      local_3d58 = 1e+30;
      dVar5 = 0.0;
      local_3d70 = 0xffffffff;
      uVar4 = 0;
      local_3cf0 = bitlengths;
      do {
        local_3cd8 = dVar5;
        ZopfliCleanLZ77Store(&currentstore);
        ZopfliInitLZ77Store(in,&currentstore);
        LZ77OptimalRun(s,in,instart,inend,&path,&pathsize,length_array,GetCostStat,&local_3c30,
                       &currentstore,&hash,costs);
        dVar5 = ZopfliCalculateBlockSize(&currentstore,0,currentstore.size,2);
        if ((s->options->verbose_more != 0) || ((s->options->verbose != 0 && (dVar5 < local_3d58))))
        {
          fprintf(_stderr,"Iteration %d: %d bit\n",(ulong)uVar4,(ulong)(uint)(int)dVar5);
        }
        bitlengths_00 = local_3ce0;
        if (dVar5 < local_3d58) {
          ZopfliCopyLZ77Store(&currentstore,local_3d08);
          memcpy(&beststats,&local_3c30,0x900);
          memcpy(beststats.dists,count,0x100);
          memcpy(beststats.ll_symbols,bitlengths_00,0x900);
          memcpy(beststats.d_symbols,bitlengths,0x100);
          local_3d58 = dVar5;
        }
        memcpy(&laststats,&local_3c30,0x900);
        memcpy(local_3cf8,count,0x100);
        memcpy(local_3d00,bitlengths_00,0x900);
        memcpy(local_3ce8,bitlengths,0x100);
        memset(&local_3c30,0,0xa00);
        GetStatistics(&currentstore,&local_3c30);
        if (local_3d70 != 0xffffffff) {
          lVar1 = 0;
          do {
            dVar6 = (((double)(laststats.litlens[lVar1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar1] & 0xffffffff | 0x4330000000000000)) * 0.5 +
                    ((double)(local_3c30.litlens[lVar1] >> 0x20 | 0x4530000000000000) -
                    1.9342813118337666e+25) +
                    (double)(local_3c30.litlens[lVar1] & 0xffffffff | 0x4330000000000000);
            dVar7 = (((double)(laststats.litlens[lVar1 + 1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar1 + 1] & 0xffffffff | 0x4330000000000000)) * 0.5
                    + ((double)(local_3c30.litlens[lVar1 + 1] >> 0x20 | 0x4530000000000000) -
                      1.9342813118337666e+25) +
                      (double)(local_3c30.litlens[lVar1 + 1] & 0xffffffff | 0x4330000000000000);
            uVar2 = (ulong)dVar6;
            uVar3 = (ulong)dVar7;
            local_3c30.litlens[lVar1] =
                 (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
            local_3c30.litlens[lVar1 + 1] =
                 (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
            lVar1 = lVar1 + 2;
          } while (lVar1 != 0x120);
          lVar1 = 0x120;
          do {
            dVar6 = (((double)(laststats.litlens[lVar1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar1] & 0xffffffff | 0x4330000000000000)) * 0.5 +
                    ((double)(local_3c30.litlens[lVar1] >> 0x20 | 0x4530000000000000) -
                    1.9342813118337666e+25) +
                    (double)(local_3c30.litlens[lVar1] & 0xffffffff | 0x4330000000000000);
            dVar7 = (((double)(laststats.litlens[lVar1 + 1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar1 + 1] & 0xffffffff | 0x4330000000000000)) * 0.5
                    + ((double)(local_3c30.litlens[lVar1 + 1] >> 0x20 | 0x4530000000000000) -
                      1.9342813118337666e+25) +
                      (double)(local_3c30.litlens[lVar1 + 1] & 0xffffffff | 0x4330000000000000);
            uVar2 = (ulong)dVar6;
            uVar3 = (ulong)dVar7;
            local_3c30.litlens[lVar1] =
                 (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
            local_3c30.litlens[lVar1 + 1] =
                 (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
            lVar1 = lVar1 + 2;
          } while (lVar1 != 0x140);
          local_3c30.litlens[0x100] = 1;
          ZopfliCalculateEntropy(local_3c30.litlens,0x120,bitlengths_00);
          ZopfliCalculateEntropy(count,0x20,bitlengths);
        }
        if (((5 < uVar4) && (dVar5 == local_3cd8)) && (!NAN(dVar5) && !NAN(local_3cd8))) {
          memcpy(&local_3c30,&beststats,0x900);
          memcpy(count,beststats.dists,0x100);
          memcpy(bitlengths_00,beststats.ll_symbols,0x900);
          memcpy(bitlengths,beststats.d_symbols,0x100);
          RandomizeFreqs(&ran_state,local_3c30.litlens,0x120);
          RandomizeFreqs(&ran_state,count,0x20);
          local_3c30.litlens[0x100] = 1;
          ZopfliCalculateEntropy(local_3c30.litlens,0x120,bitlengths_00);
          ZopfliCalculateEntropy(count,0x20,bitlengths);
          local_3d70 = uVar4;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != numiterations);
    }
    free(length_array);
    free(path);
    free(costs);
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliCleanHash(&hash);
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliLZ77Optimal(ZopfliBlockState *s,
                       const unsigned char* in, size_t instart, size_t inend,
                       int numiterations,
                       ZopfliLZ77Store* store) {
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliLZ77Store currentstore;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  SymbolStats stats, beststats, laststats;
  int i;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));
  double cost;
  double bestcost = ZOPFLI_LARGE_FLOAT;
  double lastcost = 0;
  /* Try randomizing the costs a bit once the size stabilizes. */
  RanState ran_state;
  int lastrandomstep = -1;

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  InitRanState(&ran_state);
  InitStats(&stats);
  ZopfliInitLZ77Store(in, &currentstore);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  /* Do regular deflate, then loop multiple shortest path runs, each time using
  the statistics of the previous run. */

  /* Initial run. */
  ZopfliLZ77Greedy(s, in, instart, inend, &currentstore, h);
  GetStatistics(&currentstore, &stats);

  /* Repeat statistics with each time the cost model from the previous stat
  run. */
  for (i = 0; i < numiterations; i++) {
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliInitLZ77Store(in, &currentstore);
    LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                   length_array, GetCostStat, (void*)&stats,
                   &currentstore, h, costs);
    cost = ZopfliCalculateBlockSize(&currentstore, 0, currentstore.size, 2);
    if (s->options->verbose_more || (s->options->verbose && cost < bestcost)) {
      fprintf(stderr, "Iteration %d: %d bit\n", i, (int) cost);
    }
    if (cost < bestcost) {
      /* Copy to the output store. */
      ZopfliCopyLZ77Store(&currentstore, store);
      CopyStats(&stats, &beststats);
      bestcost = cost;
    }
    CopyStats(&stats, &laststats);
    ClearStatFreqs(&stats);
    GetStatistics(&currentstore, &stats);
    if (lastrandomstep != -1) {
      /* This makes it converge slower but better. Do it only once the
      randomness kicks in so that if the user does few iterations, it gives a
      better result sooner. */
      AddWeighedStatFreqs(&stats, 1.0, &laststats, 0.5, &stats);
      CalculateStatistics(&stats);
    }
    if (i > 5 && cost == lastcost) {
      CopyStats(&beststats, &stats);
      RandomizeStatFreqs(&ran_state, &stats);
      CalculateStatistics(&stats);
      lastrandomstep = i;
    }
    lastcost = cost;
  }

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanLZ77Store(&currentstore);
  ZopfliCleanHash(h);
}